

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util.cc
# Opt level: O1

vector<StringPiece,_std::allocator<StringPiece>_> *
SplitStringPiece(vector<StringPiece,_std::allocator<StringPiece>_> *__return_storage_ptr__,
                StringPiece input,char sep)

{
  pointer *ppSVar1;
  iterator iVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  size_type __n;
  char *pcVar8;
  char local_41;
  StringPiece local_40;
  
  sVar5 = input.len_;
  pcVar6 = input.str_;
  (__return_storage_ptr__->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (sVar5 == 0) {
    __n = 1;
  }
  else {
    sVar3 = 0;
    lVar7 = 0;
    do {
      lVar7 = lVar7 + (ulong)(pcVar6[sVar3] == sep);
      sVar3 = sVar3 + 1;
    } while (sVar5 != sVar3);
    __n = lVar7 + 1;
  }
  local_41 = sep;
  std::vector<StringPiece,_std::allocator<StringPiece>_>::reserve(__return_storage_ptr__,__n);
  pcVar8 = pcVar6 + sVar5;
  do {
    pcVar4 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (pcVar6,pcVar8,&local_41);
    local_40.str_ = pcVar6;
    if (pcVar4 == pcVar8) {
      local_40.len_ = (long)pcVar8 - (long)pcVar6;
      iVar2._M_current =
           (__return_storage_ptr__->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<StringPiece,_std::allocator<StringPiece>_>::_M_realloc_insert<StringPiece>
                  (__return_storage_ptr__,iVar2,&local_40);
      }
      else {
        (iVar2._M_current)->str_ = pcVar6;
        (iVar2._M_current)->len_ = local_40.len_;
        ppSVar1 = &(__return_storage_ptr__->
                   super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
    }
    else {
      local_40.len_ = (long)pcVar4 - (long)pcVar6;
      iVar2._M_current =
           (__return_storage_ptr__->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<StringPiece,_std::allocator<StringPiece>_>::_M_realloc_insert<StringPiece>
                  (__return_storage_ptr__,iVar2,&local_40);
      }
      else {
        (iVar2._M_current)->str_ = pcVar6;
        (iVar2._M_current)->len_ = local_40.len_;
        ppSVar1 = &(__return_storage_ptr__->
                   super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      pcVar6 = pcVar4 + 1;
    }
  } while (pcVar4 != pcVar8);
  return __return_storage_ptr__;
}

Assistant:

vector<StringPiece> SplitStringPiece(StringPiece input, char sep) {
  vector<StringPiece> elems;
  elems.reserve(count(input.begin(), input.end(), sep) + 1);

  StringPiece::const_iterator pos = input.begin();

  for (;;) {
    const char* next_pos = find(pos, input.end(), sep);
    if (next_pos == input.end()) {
      elems.push_back(StringPiece(pos, input.end() - pos));
      break;
    }
    elems.push_back(StringPiece(pos, next_pos - pos));
    pos = next_pos + 1;
  }

  return elems;
}